

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::ArgumentParser::ArgumentParser(ArgumentParser *this,string *description_,string *epilog_)

{
  allocator local_51;
  string local_50;
  
  Command::Command(&this->super_Command);
  (this->super_Command).super_Group.super_Base._vptr_Base =
       (_func_int **)&PTR__ArgumentParser_0011b230;
  (this->longprefix)._M_dataplus._M_p = (pointer)&(this->longprefix).field_2;
  (this->longprefix)._M_string_length = 0;
  (this->longprefix).field_2._M_local_buf[0] = '\0';
  (this->shortprefix)._M_dataplus._M_p = (pointer)&(this->shortprefix).field_2;
  (this->shortprefix)._M_string_length = 0;
  (this->shortprefix).field_2._M_local_buf[0] = '\0';
  (this->longseparator)._M_dataplus._M_p = (pointer)&(this->longseparator).field_2;
  (this->longseparator)._M_string_length = 0;
  (this->longseparator).field_2._M_local_buf[0] = '\0';
  (this->terminator)._M_dataplus._M_p = (pointer)&(this->terminator).field_2;
  (this->terminator)._M_string_length = 0;
  (this->terminator).field_2._M_local_buf[0] = '\0';
  this->allowJoinedShortValue = true;
  this->allowJoinedLongValue = true;
  this->allowSeparateShortValue = true;
  this->allowSeparateLongValue = true;
  this->completion = (CompletionFlag *)0x0;
  this->readCompletion = false;
  HelpParams::HelpParams(&this->helpParams);
  std::__cxx11::string::_M_assign((string *)&(this->super_Command).description);
  std::__cxx11::string::_M_assign((string *)&(this->super_Command).epilog);
  std::__cxx11::string::string((string *)&local_50,"--",&local_51);
  LongPrefix(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"-",&local_51);
  ShortPrefix(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"=",&local_51);
  LongSeparator(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"--",&local_51);
  std::__cxx11::string::_M_assign((string *)&this->terminator);
  std::__cxx11::string::~string((string *)&local_50);
  SetArgumentSeparations(this,true,true,true,true);
  (this->super_Command).super_Group.super_Base.matched = true;
  return;
}

Assistant:

ArgumentParser(const std::string &description_, const std::string &epilog_ = std::string())
            {
                Description(description_);
                Epilog(epilog_);
                LongPrefix("--");
                ShortPrefix("-");
                LongSeparator("=");
                Terminator("--");
                SetArgumentSeparations(true, true, true, true);
                matched = true;
            }